

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int ffi_pairs(lua_State *L,MMS mm)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  GCcdata *pGVar4;
  cTValue *tv_00;
  GCstr *pGVar5;
  uint in_ESI;
  lua_State *in_RDI;
  cTValue *tv;
  CType *ct;
  CTypeID id;
  CTState *cts;
  CTState *cts_1;
  CType *ct_1;
  GCstr *in_stack_00000178;
  CTypeID in_stack_00000184;
  lua_State *in_stack_00000188;
  int in_stack_ffffffffffffff4c;
  lua_State *in_stack_ffffffffffffff50;
  lua_State *L_00;
  undefined4 in_stack_ffffffffffffff68;
  uint *local_68;
  
  plVar3 = (long *)(ulong)*(uint *)((ulong)(in_RDI->glref).ptr32 + 0x194);
  plVar3[2] = (long)in_RDI;
  pGVar4 = ffi_checkcdata(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  uVar1 = (uint)pGVar4->ctypeid;
  for (local_68 = (uint *)(*plVar3 + (ulong)uVar1 * 0x10); *local_68 >> 0x1c == 8;
      local_68 = (uint *)(*plVar3 + (ulong)(*local_68 & 0xffff) * 0x10)) {
  }
  if (*local_68 >> 0x1c == 2) {
    uVar1 = *local_68 & 0xffff;
  }
  tv_00 = lj_ctype_meta((CTState *)CONCAT44(uVar1,in_stack_ffffffffffffff68),
                        (CTypeID)((ulong)local_68 >> 0x20),(MMS)local_68);
  if (tv_00 == (cTValue *)0x0) {
    L_00 = in_RDI;
    pGVar5 = lj_ctype_repr(in_stack_00000188,in_stack_00000184,in_stack_00000178);
    lj_err_callerv(L_00,LJ_ERR_FFI_BADMM,pGVar5 + 1,
                   (ulong)*(uint *)((ulong)(in_RDI->glref).ptr32 + 0x198 + (ulong)in_ESI * 4) + 0x10
                  );
  }
  iVar2 = lj_meta_tailcall(in_RDI,tv_00);
  return iVar2;
}

Assistant:

static int ffi_pairs(lua_State *L, MMS mm)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkcdata(L, 1)->ctypeid;
  CType *ct = ctype_raw(cts, id);
  cTValue *tv;
  if (ctype_isptr(ct->info)) id = ctype_cid(ct->info);
  tv = lj_ctype_meta(cts, id, mm);
  if (!tv)
    lj_err_callerv(L, LJ_ERR_FFI_BADMM, strdata(lj_ctype_repr(L, id, NULL)),
		   strdata(mmname_str(G(L), mm)));
  return lj_meta_tailcall(L, tv);
}